

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

uint8_t argumentList(void)

{
  _Bool _Var1;
  ulong in_RAX;
  uint8_t argCount;
  TokenType unaff_retaddr;
  char *message;
  
  message = (char *)(in_RAX & 0xffffffffffffff);
  _Var1 = check(TOKEN_RIGHT_PAREN);
  if (!_Var1) {
    do {
      expression();
      if ((char)((ulong)message >> 0x38) == -1) {
        error((char *)0x106ab3);
      }
      message = (char *)CONCAT17((char)((ulong)message >> 0x38) + '\x01',(int7)message);
      _Var1 = match(0x106ac7);
    } while (_Var1);
  }
  consume(unaff_retaddr,message);
  return (uint8_t)((ulong)message >> 0x38);
}

Assistant:

static uint8_t argumentList() {
    uint8_t argCount = 0;
    if (!check(TOKEN_RIGHT_PAREN)) {
        do {
            expression();

            if (argCount == PARAMS_MAX) {
                error("Cannot have more than 255 arguments.");
            }

            argCount++;
        } while (match(TOKEN_COMMA));
    }

    consume(TOKEN_RIGHT_PAREN, "Expect ')' after arguments.");
    return argCount;
}